

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_swap.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>_>
::Base_swap(Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>_>
            *this,uint numberOfColumns)

{
  ulong __n;
  reference pvVar1;
  uint local_2c;
  allocator<unsigned_int> local_25;
  Index i;
  allocator<unsigned_int> local_15;
  uint local_14;
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>_>
  *pBStack_10;
  uint numberOfColumns_local;
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false>_>_>_>
  *this_local;
  
  local_14 = numberOfColumns;
  pBStack_10 = this;
  std::allocator<unsigned_int>::allocator(&local_15);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->indexToRow_,(ulong)numberOfColumns,&local_15);
  std::allocator<unsigned_int>::~allocator(&local_15);
  __n = (ulong)local_14;
  std::allocator<unsigned_int>::allocator(&local_25);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->rowToIndex_,__n,&local_25)
  ;
  std::allocator<unsigned_int>::~allocator(&local_25);
  this->rowSwapped_ = false;
  for (local_2c = 0; local_2c < local_14; local_2c = local_2c + 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->indexToRow_,(ulong)local_2c);
    *pvVar1 = local_2c;
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->rowToIndex_,(ulong)local_2c);
    *pvVar1 = local_2c;
  }
  return;
}

Assistant:

inline Base_swap<Master_matrix, Base_matrix>::Base_swap(unsigned int numberOfColumns)
    : indexToRow_(numberOfColumns), rowToIndex_(numberOfColumns), rowSwapped_(false)
{
  for (Index i = 0; i < numberOfColumns; i++) {
    indexToRow_[i] = i;
    rowToIndex_[i] = i;
  }
}